

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O1

int fillpara(int f,int n)

{
  char cVar1;
  int iVar2;
  int iVar3;
  line *plVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  line *plVar9;
  long lVar10;
  uint uVar11;
  byte bVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  undefined8 uStack_160;
  byte local_158 [8];
  char wbuf [256];
  
  if (n == 0) {
    iVar7 = 1;
  }
  else {
    uStack_160 = 0x114c5f;
    undo_boundary_enable(8,0);
    uStack_160 = 0x114c75;
    do_gotoeop(8,1,(int *)local_158);
    if (curwp->w_doto == 0) {
      plVar9 = (line *)&curwp->w_dotp;
    }
    else {
      uStack_160 = 0x114c8b;
      lnewline();
      plVar9 = curwp->w_dotp;
    }
    plVar9 = plVar9->l_fp;
    uStack_160 = 0x114cba;
    gotobop(8,1);
    do {
      uStack_160 = 0x114cbf;
      iVar7 = inword();
      if (iVar7 != 0) break;
      uStack_160 = 0x114cd2;
      iVar7 = forwchar(8,1);
    } while (iVar7 != 0);
    iVar14 = curwp->w_doto;
    bVar6 = true;
    bVar5 = false;
    uVar11 = 0;
    do {
      iVar2 = curwp->w_doto;
      plVar4 = curwp->w_dotp;
      iVar3 = plVar4->l_used;
      if (iVar2 == iVar3) {
        if (plVar4->l_fp == plVar9) {
          bVar5 = true;
        }
        bVar12 = 0x20;
      }
      else {
        bVar12 = plVar4->l_text[iVar2];
      }
      iVar7 = 0;
      uStack_160 = 0x114d32;
      iVar8 = ldelete(1,0);
      if (iVar8 == 0 && !bVar5) goto LAB_00114f3b;
      if ((bVar12 == 9) || (bVar12 == 0x20)) {
        if (uVar11 == 0) {
          uVar11 = 0;
        }
        else {
          uVar15 = (ulong)uVar11;
          if ((!bVar5) && (uVar15 = (ulong)uVar11, dblspace != 0)) {
            if (iVar2 != iVar3) {
              if (((curwp->w_doto != curwp->w_dotp->l_used) &&
                  (cVar1 = curwp->w_dotp->l_text[curwp->w_doto], cVar1 != ' ')) &&
                 (uVar15 = (ulong)uVar11, cVar1 != '\t')) goto LAB_00114e5a;
            }
            if ((cinfo[local_158[(long)(int)uVar11 + -1]] & 0x10U) == 0) {
              uVar15 = (ulong)uVar11;
              if ((1 < (int)uVar11 && local_158[(long)(int)uVar11 + -1] == 0x29) &&
                 (uVar15 = (ulong)uVar11,
                 ((byte)cinfo[local_158[uVar11 - 2]] >> 4 & (int)uVar11 < 0xff) != 0)) {
LAB_00114e4e:
                uVar15 = (ulong)(uVar11 + 1);
                local_158[(int)uVar11] = 0x20;
              }
            }
            else {
              uVar15 = (ulong)uVar11;
              if ((int)uVar11 < 0xff) goto LAB_00114e4e;
            }
          }
LAB_00114e5a:
          if (fillcol < (int)(iVar14 + uVar11 + 1)) {
            if ((0 < curwp->w_doto) &&
               (uVar11 = curwp->w_doto - 1, curwp->w_dotp->l_text[uVar11] == ' ')) {
              curwp->w_doto = uVar11;
              uStack_160 = 0x114e9b;
              ldelete(1,0);
            }
            uStack_160 = 0x114ea0;
            lnewline();
            iVar14 = 0;
          }
          else {
            if (!bVar6) {
              iVar14 = iVar14 + 1;
              uStack_160 = 0x114ed0;
              linsert(1,0x20);
            }
            bVar6 = false;
          }
          if ((int)uVar15 < 1) {
            uVar11 = 0;
          }
          else {
            uVar13 = 0;
            do {
              uStack_160 = 0x114ef9;
              linsert(1,(int)(char)local_158[uVar13]);
              uVar13 = uVar13 + 1;
            } while (uVar15 != uVar13);
            iVar14 = (int)uVar15 + iVar14;
            uVar11 = 0;
          }
        }
      }
      else if ((int)uVar11 < 0xff) {
        lVar10 = (long)(int)uVar11;
        uVar11 = uVar11 + 1;
        local_158[lVar10] = bVar12;
      }
      else {
        uStack_160 = 0x114e37;
        ewprintf("Word too long!");
      }
    } while (!bVar5);
    uStack_160 = 0x114f26;
    lnewline();
    iVar7 = 1;
    uStack_160 = 0x114f3b;
    backchar(8,1);
LAB_00114f3b:
    uStack_160 = 0x114f4a;
    undo_boundary_enable(8,1);
  }
  return iVar7;
}

Assistant:

int
fillpara(int f, int n)
{
	int	 c;		/* current char during scan		*/
	int	 wordlen;	/* length of current word		*/
	int	 clength;	/* position on line during fill		*/
	int	 i;		/* index during word copy		*/
	int	 eopflag;	/* Are we at the End-Of-Paragraph?	*/
	int	 firstflag;	/* first word? (needs no space)		*/
	int	 newlength;	/* tentative new line length		*/
	int	 eolflag;	/* was at end of line			*/
	int	 retval;	/* return value				*/
	struct line	*eopline;	/* pointer to line just past EOP	*/
	char	 wbuf[MAXWORD];	/* buffer for current word		*/

	if (n == 0)
		return (TRUE);

	undo_boundary_enable(FFRAND, 0);

	/* record the pointer to the line just past the EOP */
	(void)gotoeop(FFRAND, 1);
	if (curwp->w_doto != 0) {
		/* paragraph ends at end of buffer */
		(void)lnewline();
		eopline = lforw(curwp->w_dotp);
	} else
		eopline = curwp->w_dotp;

	/* and back top the beginning of the paragraph */
	(void)gotobop(FFRAND, 1);

	/* initialize various info */
	while (inword() == 0 && forwchar(FFRAND, 1));

	clength = curwp->w_doto;
	wordlen = 0;

	/* scan through lines, filling words */
	firstflag = TRUE;
	eopflag = FALSE;
	while (!eopflag) {

		/* get the next character in the paragraph */
		if ((eolflag = (curwp->w_doto == llength(curwp->w_dotp)))) {
			c = ' ';
			if (lforw(curwp->w_dotp) == eopline)
				eopflag = TRUE;
		} else
			c = lgetc(curwp->w_dotp, curwp->w_doto);

		/* and then delete it */
		if (ldelete((RSIZE) 1, KNONE) == FALSE && !eopflag) {
			retval = FALSE;
			goto cleanup;
		}

		/* if not a separator, just add it in */
		if (c != ' ' && c != '\t') {
			if (wordlen < MAXWORD - 1)
				wbuf[wordlen++] = c;
			else {
				/*
				 * You lose chars beyond MAXWORD if the word
				 * is too long. I'm too lazy to fix it now; it
				 * just silently truncated the word before,
				 * so I get to feel smug.
				 */
				ewprintf("Word too long!");
			}
		} else if (wordlen) {

			/* calculate tentative new length with word added */
			newlength = clength + 1 + wordlen;

			/*
			 * if at end of line or at doublespace and previous
			 * character was one of '.','?','!' doublespace here.
			 * behave the same way if a ')' is preceded by a
			 * [.?!] and followed by a doublespace.
			 */
			if (dblspace && (!eopflag && ((eolflag ||
			    curwp->w_doto == llength(curwp->w_dotp) ||
			    (c = lgetc(curwp->w_dotp, curwp->w_doto)) == ' '
			    || c == '\t') && (ISEOSP(wbuf[wordlen - 1]) ||
			    (wbuf[wordlen - 1] == ')' && wordlen >= 2 &&
			    ISEOSP(wbuf[wordlen - 2])))) &&
			    wordlen < MAXWORD - 1))
				wbuf[wordlen++] = ' ';

			/* at a word break with a word waiting */
			if (newlength <= fillcol) {
				/* add word to current line */
				if (!firstflag) {
					(void)linsert(1, ' ');
					++clength;
				}
				firstflag = FALSE;
			} else {
				if (curwp->w_doto > 0 &&
				    lgetc(curwp->w_dotp, curwp->w_doto - 1) == ' ') {
					curwp->w_doto -= 1;
					(void)ldelete((RSIZE) 1, KNONE);
				}
				/* start a new line */
				(void)lnewline();
				clength = 0;
			}

			/* and add the word in in either case */
			for (i = 0; i < wordlen; i++) {
				(void)linsert(1, wbuf[i]);
				++clength;
			}
			wordlen = 0;
		}
	}
	/* and add a last newline for the end of our new paragraph */
	(void)lnewline();

	/*
	 * We really should wind up where we started, (which is hard to keep
	 * track of) but I think the end of the last line is better than the
	 * beginning of the blank line.
	 */
	(void)backchar(FFRAND, 1);
	retval = TRUE;
cleanup:
	undo_boundary_enable(FFRAND, 1);
	return (retval);
}